

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

void ZSTD_seqToCodes(seqStore_t *seqStorePtr)

{
  ushort uVar1;
  seqDef *psVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  seqDef *psVar6;
  seqDef *psVar7;
  U32 UVar8;
  U32 mlv;
  U32 llv;
  U32 u;
  U32 nbSeq;
  BYTE *mlCodeTable;
  BYTE *ofCodeTable;
  BYTE *llCodeTable;
  seqDef *sequences;
  seqStore_t *seqStorePtr_local;
  
  psVar2 = seqStorePtr->sequencesStart;
  pBVar3 = seqStorePtr->llCode;
  pBVar4 = seqStorePtr->ofCode;
  pBVar5 = seqStorePtr->mlCode;
  psVar6 = seqStorePtr->sequences;
  psVar7 = seqStorePtr->sequencesStart;
  for (mlv = 0; mlv < (uint)((long)psVar6 - (long)psVar7 >> 3); mlv = mlv + 1) {
    uVar1 = psVar2[mlv].matchLength;
    UVar8 = ZSTD_LLcode((uint)psVar2[mlv].litLength);
    pBVar3[mlv] = (BYTE)UVar8;
    UVar8 = ZSTD_highbit32(psVar2[mlv].offset);
    pBVar4[mlv] = (BYTE)UVar8;
    UVar8 = ZSTD_MLcode((uint)uVar1);
    pBVar5[mlv] = (BYTE)UVar8;
  }
  if (seqStorePtr->longLengthType == ZSTD_llt_literalLength) {
    pBVar3[seqStorePtr->longLengthPos] = '#';
  }
  if (seqStorePtr->longLengthType == ZSTD_llt_matchLength) {
    pBVar5[seqStorePtr->longLengthPos] = '4';
  }
  return;
}

Assistant:

void ZSTD_seqToCodes(const seqStore_t* seqStorePtr)
{
    const seqDef* const sequences = seqStorePtr->sequencesStart;
    BYTE* const llCodeTable = seqStorePtr->llCode;
    BYTE* const ofCodeTable = seqStorePtr->ofCode;
    BYTE* const mlCodeTable = seqStorePtr->mlCode;
    U32 const nbSeq = (U32)(seqStorePtr->sequences - seqStorePtr->sequencesStart);
    U32 u;
    assert(nbSeq <= seqStorePtr->maxNbSeq);
    for (u=0; u<nbSeq; u++) {
        U32 const llv = sequences[u].litLength;
        U32 const mlv = sequences[u].matchLength;
        llCodeTable[u] = (BYTE)ZSTD_LLcode(llv);
        ofCodeTable[u] = (BYTE)ZSTD_highbit32(sequences[u].offset);
        mlCodeTable[u] = (BYTE)ZSTD_MLcode(mlv);
    }
    if (seqStorePtr->longLengthType==ZSTD_llt_literalLength)
        llCodeTable[seqStorePtr->longLengthPos] = MaxLL;
    if (seqStorePtr->longLengthType==ZSTD_llt_matchLength)
        mlCodeTable[seqStorePtr->longLengthPos] = MaxML;
}